

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender fmt::v8::detail::
         write_significand<fmt::v8::appender,char,char_const*,fmt::v8::detail::digit_grouping<char>>
                   (appender out,char *significand,int significand_size,int integral_size,
                   char decimal_point,digit_grouping<char> *grouping)

{
  appender aVar1;
  basic_string_view<char> digits;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  undefined **local_238;
  undefined1 *local_230;
  long local_228;
  ulong local_220;
  undefined1 local_218 [504];
  
  if ((grouping->sep_).thousands_sep != '\0') {
    local_228 = 0;
    local_238 = &PTR_grow_0019fa50;
    local_220 = 500;
    local_230 = local_218;
    write_significand<fmt::v8::appender,char>
              ((appender)&local_238,significand,significand_size,integral_size,decimal_point);
    digits.size_._0_4_ = integral_size;
    digits.data_ = local_230;
    digits.size_._4_4_ = 0;
    digit_grouping<char>::apply<fmt::v8::appender,char>(grouping,out,digits);
    aVar1 = copy_str_noinline<char,char*,fmt::v8::appender>
                      (local_230 + integral_size,local_230 + local_228,out);
    if (local_230 != local_218) {
      operator_delete(local_230,local_220);
    }
    return (appender)
           aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container.container;
  }
  aVar1 = write_significand<fmt::v8::appender,char>
                    (out,significand,significand_size,integral_size,decimal_point);
  return (appender)aVar1.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
}

Assistant:

FMT_CONSTEXPR20 auto write_significand(OutputIt out, T significand,
                                       int significand_size, int integral_size,
                                       Char decimal_point,
                                       const Grouping& grouping) -> OutputIt {
  if (!grouping.separator()) {
    return write_significand(out, significand, significand_size, integral_size,
                             decimal_point);
  }
  auto buffer = basic_memory_buffer<Char>();
  write_significand(buffer_appender<Char>(buffer), significand,
                    significand_size, integral_size, decimal_point);
  grouping.apply(
      out, basic_string_view<Char>(buffer.data(), to_unsigned(integral_size)));
  return detail::copy_str_noinline<Char>(buffer.data() + integral_size,
                                         buffer.end(), out);
}